

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

Real amrex::MultiFab::Dot
               (MultiFab *x,int xcomp,MultiFab *y,int ycomp,int numcomp,int nghost,bool local)

{
  bool bVar1;
  int in_ECX;
  int in_ESI;
  int in_R8D;
  byte in_stack_00000008;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *yfab;
  Array4<const_double> *xfab;
  Box *bx;
  MFIter mfi;
  Real sm;
  FBData<amrex::FArrayBox> *in_stack_fffffffffffffd68;
  MFIter *in_stack_fffffffffffffd70;
  FabArray<amrex::FArrayBox> *this;
  int local_278;
  uint local_274;
  int local_270;
  undefined4 in_stack_fffffffffffffd94;
  int iVar2;
  FabArrayBase *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 local_228;
  int in_stack_fffffffffffffddc;
  MFIter *in_stack_fffffffffffffde0;
  long local_218;
  long local_210;
  int local_208;
  int local_204;
  int local_200;
  undefined1 local_1e0 [104];
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> local_178;
  undefined1 local_170 [172];
  int local_c4;
  uint uStack_c0;
  int local_bc;
  _Bit_pointer local_b8;
  int local_b0;
  FBData<amrex::FArrayBox> *local_a8;
  int local_9c;
  int iStack_98;
  int local_94;
  int local_90;
  int local_8c;
  uint local_88;
  int local_84;
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_80;
  int local_78;
  int local_74;
  uint local_70;
  int local_6c;
  MFIter *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  MultiArray4<double> local_48;
  undefined4 local_3c;
  pointer local_38;
  undefined4 local_2c;
  FBData<amrex::FArrayBox> *local_28;
  undefined4 local_1c;
  FBData<amrex::FArrayBox> *local_18;
  undefined4 local_c;
  unique_ptr<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_8;
  
  local_170[0x6b] = in_stack_00000008 & 1;
  local_170._96_8_ = (element_type *)0x0;
  local_170._112_4_ = in_R8D;
  local_170._116_4_ = in_ECX;
  local_170._132_4_ = in_ESI;
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 in_stack_fffffffffffffd98,SUB41((uint)in_stack_fffffffffffffd94 >> 0x18,0));
  while (bVar1 = MFIter::isValid((MFIter *)local_170), bVar1) {
    in_stack_fffffffffffffd68 = (FBData<amrex::FArrayBox> *)(local_1e0 + 0x4c);
    this = (FabArray<amrex::FArrayBox> *)local_170;
    MFIter::growntilebox(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    in_stack_fffffffffffffd70 = (MFIter *)local_1e0;
    local_178._M_head_impl = in_stack_fffffffffffffd68;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffffd70);
    local_1e0._64_8_ = in_stack_fffffffffffffd70;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffffd70);
    local_170._160_8_ = local_178._M_head_impl;
    local_8._M_t.
    super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
          )(__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
            )local_178._M_head_impl;
    local_c = 0;
    local_c4 = *(int *)&(local_178._M_head_impl)->fb;
    local_18 = local_178._M_head_impl;
    local_1c = 1;
    uStack_c0 = *(uint *)((_Alloc_hider *)&(local_178._M_head_impl)->fb + 4);
    local_170._144_8_ = *(undefined8 *)&(local_178._M_head_impl)->fb;
    local_28 = local_178._M_head_impl;
    local_2c = 2;
    local_170._152_4_ = (undefined4)*(size_type *)&(local_178._M_head_impl)->scomp;
    local_a8 = local_178._M_head_impl;
    local_38 = (pointer)&(local_178._M_head_impl)->ncomp;
    local_3c = 0;
    local_9c = *(int *)local_38;
    local_48.hp = (Array4<double> *)&(local_178._M_head_impl)->ncomp;
    local_4c = 1;
    iStack_98 = *(int *)&(local_178._M_head_impl)->the_recv_data;
    local_b8 = *(_Bit_pointer *)local_38;
    local_58 = &(local_178._M_head_impl)->ncomp;
    local_5c = 2;
    local_b0 = *(int *)((long)&(local_178._M_head_impl)->the_recv_data + 4);
    for (iVar2 = 0; local_270 = local_170._152_4_, iVar2 < (int)local_170._112_4_; iVar2 = iVar2 + 1
        ) {
      for (; local_274 = uStack_c0, local_270 <= local_b0; local_270 = local_270 + 1) {
        for (; local_278 = local_c4, (int)local_274 <= iStack_98; local_274 = local_274 + 1) {
          for (; local_278 <= local_9c; local_278 = local_278 + 1) {
            local_68 = (MFIter *)local_1e0._64_8_;
            local_6c = local_278;
            local_70 = local_274;
            local_74 = local_270;
            local_78 = local_170._132_4_ + iVar2;
            local_84 = local_278;
            local_88 = local_274;
            local_8c = local_270;
            local_90 = local_170._116_4_ + iVar2;
            local_170._96_8_ =
                 (double)(&((((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               *)local_1e0._64_8_)->_M_t).
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                           _vptr_FabArrayBase)
                         [(long)(local_278 - *(int *)(local_1e0._64_8_ + 0x20)) +
                          (long)(int)(local_274 - *(int *)(local_1e0._64_8_ + 0x24)) *
                          (long)*(FabArrayBase **)(local_1e0._64_8_ + 8) +
                          (long)(local_270 - *(int *)(local_1e0._64_8_ + 0x28)) *
                          *(long *)((IntVect *)(local_1e0._64_8_ + 0x10))->vect +
                          (long)local_78 *
                          *(long *)(((IntVect *)(local_1e0._64_8_ + 0x10))->vect + 2)] *
                 *(double *)
                  (CONCAT44(in_stack_fffffffffffffddc,local_228) +
                  ((long)(local_278 - local_208) +
                   (long)(int)(local_274 - local_204) * (long)in_stack_fffffffffffffde0 +
                   (local_270 - local_200) * local_218 + local_90 * local_210) * 8) +
                 (double)local_170._96_8_;
            local_80._M_t.
            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
                  )(__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
                    )&local_228;
          }
        }
      }
    }
    local_bc = local_170._152_4_;
    local_94 = local_b0;
    MFIter::operator++((MFIter *)local_170);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd70);
  if ((local_170[0x6b] & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Sum<double>
              ((double *)in_stack_fffffffffffffd70,
               (MPI_Comm)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  }
  return (Real)(element_type *)local_170._96_8_;
}

Assistant:

Real
MultiFab::Dot (const MultiFab& x, int xcomp,
               const MultiFab& y, int ycomp,
               int numcomp, int nghost, bool local)
{
    BL_ASSERT(x.boxArray() == y.boxArray());
    BL_ASSERT(x.DistributionMap() == y.DistributionMap());
    BL_ASSERT(x.nGrow() >= nghost && y.nGrow() >= nghost);

    BL_PROFILE("MultiFab::Dot()");

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& xma = x.const_arrays();
        auto const& yma = y.const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, x, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            Real t = Real(0.0);
            auto const& xfab = xma[box_no];
            auto const& yfab = yma[box_no];
            for (int n = 0; n < numcomp; ++n) {
                t += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
            }
            return t;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(x,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.growntilebox(nghost);
            Array4<Real const> const& xfab = x.const_array(mfi);
            Array4<Real const> const& yfab = y.const_array(mfi);
            AMREX_LOOP_4D(bx, numcomp, i, j, k, n,
            {
                sm += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}